

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

bool __thiscall Tokenizer::tryToGetNumber(Tokenizer *this)

{
  char cVar1;
  char cVar2;
  int iVar3;
  Mark *pMVar4;
  runtime_error *this_00;
  Stream *in_RDI;
  TokenType *type;
  double value;
  Mark mark;
  stringstream ss;
  Token *in_stack_fffffffffffffcd8;
  Token *in_stack_fffffffffffffce0;
  Token *in_stack_fffffffffffffcf0;
  undefined6 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd16;
  undefined1 in_stack_fffffffffffffd17;
  char *in_stack_fffffffffffffd18;
  ostream *poVar5;
  undefined6 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd26;
  string local_220 [32];
  TokenType *local_200;
  undefined4 local_1f8;
  undefined1 local_1f2;
  string local_1d0 [48];
  Mark local_1a0;
  stringstream local_198 [16];
  ostream local_188 [88];
  string *in_stack_fffffffffffffed0;
  Tokenizer *in_stack_fffffffffffffed8;
  bool local_1;
  
  std::__cxx11::stringstream::stringstream(local_198);
  pMVar4 = Stream::getMark(in_RDI);
  local_1a0 = *pMVar4;
  cVar1 = Stream::peek((Stream *)0x164624);
  iVar3 = isdigit((int)cVar1);
  if (iVar3 == 0) {
    local_1 = false;
  }
  else {
    cVar1 = Stream::peek((Stream *)0x164649);
    if (cVar1 == '0') {
      cVar1 = Stream::peek((Stream *)0x1646ee);
      std::operator<<(local_188,cVar1);
      Stream::advance((Stream *)in_stack_fffffffffffffce0);
    }
    else {
      while( true ) {
        cVar1 = Stream::peek((Stream *)0x164667);
        iVar3 = isdigit((int)cVar1);
        if (iVar3 == 0) break;
        cVar1 = Stream::peek((Stream *)0x164695);
        std::operator<<(local_188,cVar1);
        Stream::advance((Stream *)in_stack_fffffffffffffce0);
      }
    }
    cVar1 = Stream::peek((Stream *)0x16471f);
    if (cVar1 == '.') {
      poVar5 = local_188;
      cVar1 = Stream::peek((Stream *)0x16474c);
      std::operator<<(poVar5,cVar1);
      Stream::advance((Stream *)in_stack_fffffffffffffce0);
      while( true ) {
        cVar1 = Stream::peek((Stream *)0x16477d);
        iVar3 = isdigit((int)cVar1);
        if (iVar3 == 0) break;
        cVar1 = Stream::peek((Stream *)0x1647ab);
        std::operator<<(local_188,cVar1);
        Stream::advance((Stream *)in_stack_fffffffffffffce0);
      }
    }
    else {
      cVar2 = Stream::peek((Stream *)0x1647e1);
      iVar3 = isdigit((int)cVar2);
      if (iVar3 != 0) {
LAB_0016481d:
        local_1f2 = 1;
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(cVar1,CONCAT16(in_stack_fffffffffffffd26,in_stack_fffffffffffffd20)),
                   in_stack_fffffffffffffd18,
                   (allocator<char> *)
                   CONCAT17(in_stack_fffffffffffffd17,
                            CONCAT16(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10)));
        makeErrorMessage(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        std::runtime_error::runtime_error(this_00,local_1d0);
        local_1f2 = 0;
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cVar2 = Stream::peek((Stream *)0x164802);
      iVar3 = isalpha((int)cVar2);
      if (iVar3 != 0) goto LAB_0016481d;
    }
    std::__cxx11::stringstream::str();
    type = (TokenType *)
           std::__cxx11::stod((string *)in_stack_fffffffffffffce0,
                              (size_t *)in_stack_fffffffffffffcd8);
    std::__cxx11::string::~string(local_220);
    local_200 = type;
    Token::Token(in_stack_fffffffffffffcf0,type,(double)in_stack_fffffffffffffce0,
                 (Mark *)in_stack_fffffffffffffcd8);
    Token::operator=(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    Token::~Token((Token *)0x1649f6);
    local_1 = true;
  }
  local_1f8 = 1;
  std::__cxx11::stringstream::~stringstream(local_198);
  return local_1;
}

Assistant:

bool Tokenizer::tryToGetNumber()
{
  std::stringstream ss;
  const Mark mark = stream_.getMark();
  if(isdigit(stream_.peek()))
  {
    if(stream_.peek() != '0')
    {
      while(isdigit(stream_.peek()))
      {
        ss << stream_.peek();
        stream_.advance();
      }
    }
    else
    {
      ss << stream_.peek();
      stream_.advance();
    }

    if(stream_.peek() == '.')
    {
      ss << stream_.peek();
      stream_.advance();
      while(isdigit(stream_.peek()))
      {
        ss << stream_.peek();
        stream_.advance();
      }
    }
    else if(isdigit(stream_.peek()) || isalpha(stream_.peek()))
      throw std::runtime_error(makeErrorMessage("Unexpected character!"));
  }
  else
    return false;

  try
  {
    const double value = std::stod(ss.str());
    token_ = Token(TokenType::Number, value, mark);
  }
  catch(...)
  {
    throw std::runtime_error(makeErrorMessage("Failed to parse numeric constant!"));
  }
  return true;
}